

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int p256_generate_key(EVP_HPKE_KEY *key)

{
  int iVar1;
  uchar local_38 [8];
  uint8_t seed [32];
  EVP_HPKE_KEY *key_local;
  
  seed._24_8_ = key;
  RAND_bytes(local_38,0x20);
  iVar1 = p256_private_key_from_seed((uint8_t *)(seed._24_8_ + 8),local_38);
  if ((iVar1 != 0) &&
     (iVar1 = p256_public_from_private((uint8_t *)(seed._24_8_ + 0x28),(uint8_t *)(seed._24_8_ + 8))
     , iVar1 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

static int p256_generate_key(EVP_HPKE_KEY *key) {
  uint8_t seed[P256_SEED_LEN];
  RAND_bytes(seed, sizeof(seed));
  if (!p256_private_key_from_seed(key->private_key, seed) ||
      !p256_public_from_private(key->public_key, key->private_key)) {
    return 0;
  }
  return 1;
}